

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O1

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_priority_change_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  native_handle_type nVar4;
  log_entry *this_00;
  pointer psVar5;
  _func_int *p_Var6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  element_type *this_01;
  buffer *this_02;
  size_t sVar10;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _func_int **pp_Var12;
  _func_int **pp_Var13;
  bool bVar14;
  ptr<cluster_config> pVar15;
  undefined1 auVar16 [16];
  ptr<resp_msg> pVar17;
  ptr<cluster_config> c_conf;
  string local_60;
  _func_int **local_40;
  element_type *local_38;
  
  nVar4 = *(native_handle_type *)(in_RDX + 8);
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  this->_vptr_raft_server = (_func_int **)0x0;
  this_01 = (element_type *)operator_new(0xb0);
  (this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  this_01->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_00182270;
  uVar2 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (this_01->bg_commit_thread_)._M_id._M_thread = nVar4;
  *(undefined4 *)&(this_01->bg_append_thread_)._M_id._M_thread = 0x19;
  *(undefined4 *)((long)&(this_01->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
  *(undefined4 *)&this_01->bg_append_ea_ = uVar1;
  (this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_001822c0;
  (this_01->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (this_01->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  this_01->votes_responded_ = 0;
  this_01->votes_granted_ = 0;
  (this_01->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(this_01->priority_change_timer_).first_event_fired_ = 0;
  (this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (this_01->priority_change_timer_).t_created_.__d.__r = 0;
  (this_01->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(this_01->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(this_01->initialized_)._M_base = 0;
  this_01->id_ = 0;
  this_01->my_priority_ = 0;
  *(undefined1 *)&this_01->target_priority_ = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  this->_vptr_raft_server =
       (_func_int **)
       &(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  _Var11._M_pi = extraout_RDX;
  if (*(undefined8 **)(in_RDX + 0x40) == *(undefined8 **)(in_RDX + 0x38)) {
    psVar5 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar5 == (pointer)0x0) ||
       (iVar7 = (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
       _Var11._M_pi = extraout_RDX_03, iVar7 < 3)) goto LAB_001403b5;
    psVar5 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_60,"no log entry");
    (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar5,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
      ,"handle_priority_change_req",0xa2,&local_60);
    _Var11._M_pi = extraout_RDX_04;
  }
  else {
    this_00 = (log_entry *)**(undefined8 **)(in_RDX + 0x38);
    if ((this_00->buff_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      psVar5 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((psVar5 == (pointer)0x0) ||
         (iVar7 = (*(code *)(psVar5->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
         , _Var11._M_pi = extraout_RDX_05, iVar7 < 3)) goto LAB_001403b5;
      psVar5 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_(&local_60,"empty buffer");
      (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar5,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                        ,"handle_priority_change_req",0xa6,&local_60);
      _Var11._M_pi = extraout_RDX_06;
    }
    else {
      this_02 = log_entry::get_buf(this_00);
      buffer::pos(this_02,0);
      sVar10 = buffer::size(this_02);
      if (7 < sVar10) {
        uVar8 = buffer::get_int(this_02);
        uVar9 = buffer::get_int(this_02);
        if (uVar8 == *(uint *)&(req->log_entries_).
                               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) {
          *(uint *)((long)&(req->log_entries_).
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 4) = uVar9;
        }
        pVar15 = get_config((raft_server *)&stack0xffffffffffffffc0);
        _Var11 = pVar15.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        pp_Var13 = local_40 + 7;
        bVar14 = false;
        pp_Var12 = pp_Var13;
        do {
          pp_Var12 = (_func_int **)*pp_Var12;
          if (pp_Var12 == pp_Var13) break;
          p_Var6 = pp_Var12[2];
          uVar3 = *(uint *)p_Var6;
          if (uVar3 == uVar8) {
            auVar16 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
            _Var11._M_pi = auVar16._8_8_;
            *(long *)&(this_01->initialized_)._M_base = auVar16._0_8_;
            *(undefined1 *)&this_01->target_priority_ = 1;
            psVar5 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((psVar5 != (pointer)0x0) &&
               (iVar7 = (*(code *)(psVar5->
                                  super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr[1].buff_.
                                  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)(), _Var11._M_pi = extraout_RDX_08, 3 < iVar7)) {
              psVar5 = req[9].log_entries_.
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              msg_if_given_abi_cxx11_
                        (&local_60,"change peer %d priority: %d -> %d",(ulong)uVar8,
                         (ulong)*(uint *)(p_Var6 + 0x4c),(ulong)uVar9);
              (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)(psVar5,4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                               ,"handle_priority_change_req",0xbe,&local_60);
              _Var11._M_pi = extraout_RDX_09;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p);
                _Var11._M_pi = extraout_RDX_10;
              }
            }
            *(uint *)(p_Var6 + 0x4c) = uVar9;
            bVar14 = true;
          }
        } while (uVar3 != uVar8);
        if (pp_Var12 == pp_Var13) {
          psVar5 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((psVar5 != (pointer)0x0) &&
             (iVar7 = (*(code *)(psVar5->
                                super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr[1].buff_.
                                super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)(), _Var11._M_pi = extraout_RDX_12, 2 < iVar7)) {
            psVar5 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_(&local_60,"cannot find peer %d",(ulong)uVar8);
            (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar5,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                       ,"handle_priority_change_req",0xc3,&local_60);
            _Var11._M_pi = extraout_RDX_13;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p);
              _Var11._M_pi = extraout_RDX_14;
            }
          }
          this_01 = local_38;
          if (local_38 == (element_type *)0x0) goto LAB_001403b5;
        }
        else {
          if (local_38 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
            _Var11._M_pi = extraout_RDX_11;
          }
          if (bVar14) goto LAB_001403b5;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        _Var11._M_pi = extraout_RDX_15;
        goto LAB_001403b5;
      }
      psVar5 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      _Var11._M_pi = extraout_RDX_00;
      if ((psVar5 == (pointer)0x0) ||
         (iVar7 = (*(code *)(psVar5->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
         , _Var11._M_pi = extraout_RDX_01, iVar7 < 3)) goto LAB_001403b5;
      psVar5 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar10 = buffer::size(this_02);
      msg_if_given_abi_cxx11_(&local_60,"wrong buffer size: %zu",sVar10);
      (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar5,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                        ,"handle_priority_change_req",0xad,&local_60);
      _Var11._M_pi = extraout_RDX_02;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
    _Var11._M_pi = extraout_RDX_07;
  }
LAB_001403b5:
  pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_priority_change_req(req_msg& req) {
    // NOTE: now this function is protected by lock.
    ptr<resp_msg> resp
        ( cs_new<resp_msg>
          ( req.get_term(),
            msg_type::priority_change_response,
            id_,
            req.get_src() ) );

    std::vector< ptr<log_entry> >& v = req.log_entries();
    if (!v.size()) {
        p_wn("no log entry");
        return resp;
    }
    if (v[0]->is_buf_null()) {
        p_wn("empty buffer");
        return resp;
    }

    buffer& buf = v[0]->get_buf();
    buf.pos(0);
    if (buf.size() < sz_int * 2) {
        p_wn("wrong buffer size: %zu", buf.size());
        return resp;
    }

    int32 t_id = buf.get_int();
    int32 t_priority = buf.get_int();

    if (t_id == id_) {
        my_priority_ = t_priority;
    }

    ptr<cluster_config> c_conf = get_config();
    for (auto& entry: c_conf->get_servers()) {
        srv_config* s_conf = entry.get();
        if ( s_conf->get_id() == t_id ) {
            resp->accept(log_store_->next_slot());
            p_in("change peer %d priority: %d -> %d",
                 t_id, s_conf->get_priority(), t_priority);
            s_conf->set_priority(t_priority);
            return resp;
        }
    }
    p_wn("cannot find peer %d", t_id);

    return resp;
}